

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nuklear.h
# Opt level: O3

void stbtt__v_prefilter(uchar *pixels,int w,int h,int stride_in_bytes,uint kernel_width)

{
  byte bVar1;
  byte bVar2;
  uint uVar3;
  uint uVar4;
  uint uVar5;
  ulong uVar6;
  long lVar7;
  byte *pbVar8;
  int iVar9;
  long lVar10;
  uchar buffer [8];
  byte local_50 [8];
  ulong local_48;
  int local_40;
  int local_3c;
  ulong local_38;
  
  local_50[0] = 0;
  local_50[1] = 0;
  local_50[2] = 0;
  local_50[3] = 0;
  local_50[4] = 0;
  local_50[5] = 0;
  local_50[6] = 0;
  local_50[7] = 0;
  if (0 < w) {
    local_48 = (ulong)(h - kernel_width);
    lVar10 = (long)stride_in_bytes;
    uVar5 = (h - kernel_width) + 1;
    iVar9 = 0;
    local_38 = (ulong)(kernel_width - 2);
    local_40 = h;
    local_3c = w;
    do {
      memset(local_50,0,(ulong)kernel_width);
      if ((uint)local_38 < 4) {
        (*(code *)(&DAT_0015b7b4 + *(int *)(&DAT_0015b7b4 + local_38 * 4)))();
        return;
      }
      if ((int)local_48 < 0) {
        uVar4 = 0;
        uVar3 = 0;
      }
      else {
        uVar6 = 0;
        uVar4 = 0;
        pbVar8 = pixels;
        do {
          bVar1 = *pbVar8;
          bVar2 = local_50[(uint)uVar6 & 7];
          local_50[kernel_width + (uint)uVar6 & 7] = bVar1;
          uVar4 = uVar4 + ((uint)bVar1 - (uint)bVar2);
          *pbVar8 = (byte)(uVar4 / kernel_width);
          uVar6 = uVar6 + 1;
          pbVar8 = pbVar8 + lVar10;
          uVar3 = uVar5;
        } while (uVar5 != uVar6);
      }
      if ((int)uVar3 < local_40) {
        lVar7 = (long)(int)uVar3;
        pbVar8 = pixels + lVar10 * lVar7;
        do {
          uVar4 = uVar4 - local_50[(uint)lVar7 & 7];
          *pbVar8 = (byte)(uVar4 / kernel_width);
          lVar7 = lVar7 + 1;
          pbVar8 = pbVar8 + lVar10;
        } while (h != lVar7);
      }
      pixels = pixels + 1;
      iVar9 = iVar9 + 1;
    } while (iVar9 != local_3c);
  }
  return;
}

Assistant:

static void stbtt__v_prefilter(unsigned char *pixels, int w, int h, int stride_in_bytes, unsigned int kernel_width)
{
unsigned char buffer[STBTT_MAX_OVERSAMPLE];
int safe_h = h - kernel_width;
int j;
STBTT_memset(buffer, 0, STBTT_MAX_OVERSAMPLE); /*  suppress bogus warning from VS2013 -analyze */
for (j=0; j < w; ++j) {
int i;
unsigned int total;
STBTT_memset(buffer, 0, kernel_width);

total = 0;

/*  make kernel_width a constant in common cases so compiler can optimize out the divide */
switch (kernel_width) {
case 2:
for (i=0; i <= safe_h; ++i) {
total += pixels[i*stride_in_bytes] - buffer[i & STBTT__OVER_MASK];
buffer[(i+kernel_width) & STBTT__OVER_MASK] = pixels[i*stride_in_bytes];
pixels[i*stride_in_bytes] = (unsigned char) (total / 2);
}
break;
case 3:
for (i=0; i <= safe_h; ++i) {
total += pixels[i*stride_in_bytes] - buffer[i & STBTT__OVER_MASK];
buffer[(i+kernel_width) & STBTT__OVER_MASK] = pixels[i*stride_in_bytes];
pixels[i*stride_in_bytes] = (unsigned char) (total / 3);
}
break;
case 4:
for (i=0; i <= safe_h; ++i) {
total += pixels[i*stride_in_bytes] - buffer[i & STBTT__OVER_MASK];
buffer[(i+kernel_width) & STBTT__OVER_MASK] = pixels[i*stride_in_bytes];
pixels[i*stride_in_bytes] = (unsigned char) (total / 4);
}
break;
case 5:
for (i=0; i <= safe_h; ++i) {
total += pixels[i*stride_in_bytes] - buffer[i & STBTT__OVER_MASK];
buffer[(i+kernel_width) & STBTT__OVER_MASK] = pixels[i*stride_in_bytes];
pixels[i*stride_in_bytes] = (unsigned char) (total / 5);
}
break;
default:
for (i=0; i <= safe_h; ++i) {
total += pixels[i*stride_in_bytes] - buffer[i & STBTT__OVER_MASK];
buffer[(i+kernel_width) & STBTT__OVER_MASK] = pixels[i*stride_in_bytes];
pixels[i*stride_in_bytes] = (unsigned char) (total / kernel_width);
}
break;
}

for (; i < h; ++i) {
STBTT_assert(pixels[i*stride_in_bytes] == 0);
total -= buffer[i & STBTT__OVER_MASK];
pixels[i*stride_in_bytes] = (unsigned char) (total / kernel_width);
}

pixels += 1;
}
}